

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_inst.c
# Opt level: O2

void if_op(vm *v,instruction *inst)

{
  int32 *piVar1;
  func_type bt_00;
  _Bool _Var2;
  vec *instructions;
  func_type bt;
  
  piVar1 = (int32 *)inst->arg;
  get_block_type(&bt,v,*piVar1);
  _Var2 = popBool(&v->operandStack);
  instructions = (vec *)(piVar1 + 2);
  if (!_Var2) {
    instructions = (vec *)(piVar1 + 0x16);
  }
  bt_00.param_types = bt.param_types;
  bt_00.param_count = bt.param_count;
  bt_00._4_4_ = bt._4_4_;
  bt_00.return_count = bt.return_count;
  bt_00._20_4_ = bt._20_4_;
  bt_00.return_types = bt.return_types;
  enterBlock(v,'\x04',bt_00,instructions);
  return;
}

Assistant:

void if_op(vm *v, instruction *inst) {
    ifArgs *ia = (ifArgs *) inst->arg;
    func_type bt = get_block_type(v, ia->blockType);
    bool if_true = popBool(&v->operandStack);
    if (if_true) {
        enterBlock(v, If, bt, &ia->instructions1);
    } else {
        enterBlock(v, If, bt, &ia->instructions2);
    }
}